

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O2

void SocketManager::print(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  lVar1 = 0;
  for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
    if ((uint)node_type != uVar3) {
      lVar2 = lVar2 + socket_io[node_type][uVar3]->send_num;
      lVar1 = lVar1 + socket_io[node_type][uVar3]->recv_num;
    }
  }
  printf("tot_send: %lld tot_recv: %lld\n",lVar2,lVar1);
  return;
}

Assistant:

void SocketManager::print() {
    ll tot_send = 0, tot_recv = 0;
    for (int i = 0; i < M; i++) {
        if (node_type != i) {
            tot_send += socket_io[node_type][i]->send_num;
            tot_recv += socket_io[node_type][i]->recv_num;
        }
    }
    DBGprint("tot_send: %lld tot_recv: %lld\n", tot_send, tot_recv);
}